

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall Fixpp::ParsingContext::setError(ParsingContext *this,Type type,char *errFmt,...)

{
  undefined8 *puVar1;
  StreamBuf<char> *pSVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  char local_248 [8];
  char errStr [255];
  undefined8 local_98;
  va_list args;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Type local_34;
  
  pSVar2 = this->cursor->buf;
  lVar3 = *(long *)&pSVar2->field_0x10;
  lVar4 = *(long *)&pSVar2->field_0x8;
  local_34 = type;
  memset(local_248,0,0xff);
  args[0]._0_8_ = &stack0x00000008;
  local_98 = 0x3000000018;
  args[0].overflow_arg_area = errStr + 0xf8;
  iVar5 = vsnprintf(local_248,0xff,errFmt,&local_98);
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_248,local_248 + iVar5);
  if (local_58 == &local_48) {
    uStack_60 = uStack_40;
    local_58 = &local_68;
  }
  *(Type *)&(this->error).storage_ = local_34;
  *(long *)((long)&(this->error).storage_ + 8) = lVar3 - lVar4;
  puVar1 = (undefined8 *)((long)&(this->error).storage_ + 0x20);
  *(undefined8 **)((long)&(this->error).storage_ + 0x10) = puVar1;
  if (local_58 == &local_68) {
    *puVar1 = local_48;
    *(undefined8 *)((long)&(this->error).storage_ + 0x28) = uStack_60;
  }
  else {
    *(undefined8 **)((long)&(this->error).storage_ + 0x10) = local_58;
    *(undefined8 *)((long)&(this->error).storage_ + 0x20) = local_48;
  }
  *(undefined8 *)((long)&(this->error).storage_ + 0x18) = local_50;
  (this->error).empty_ = false;
  return;
}

Assistant:

void setError(ErrorKind::Type type, const char* errFmt, ...)
        {
            auto column = static_cast<size_t>(cursor);

            char errStr[255];
            std::memset(errStr, 0, sizeof errStr);
            va_list args;
            va_start(args, errFmt);
            auto count = std::vsnprintf(errStr, sizeof errStr, errFmt, args);
            va_end(args);

            error.construct(type, column, std::string(errStr, count));
        }